

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ga_malloc.c
# Opt level: O3

void * ga_malloc(Integer nelem,int type,char *name)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Integer IVar3;
  long nelem_00;
  Boolean BVar4;
  Integer *memhandle;
  ulong uVar5;
  Integer handle;
  Integer local_30;
  Integer *local_28;
  
  IVar3 = pnga_type_f2c((long)type);
  uVar5 = *(ulong *)(BYTE_ARRAY_001d22b1 + IVar3 * 0x10 + 0x2d7);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar5;
  if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x10)) % auVar1,0) != 0) {
    pnga_error("ga_malloc: GA datatype cannot be aligned.Adjust ALIGNMENT",0);
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar5;
  nelem_00 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x20)) / auVar2,0) + nelem;
  if (ga_usesMA == 0) {
    memhandle = (Integer *)(*ga_ext_alloc)(nelem_00 * uVar5,(int)uVar5,name);
  }
  else {
    memhandle = &local_30;
    BVar4 = MA_push_stack((long)type,nelem_00,name,memhandle);
    if (BVar4 == 0) {
      pnga_error("ga_malloc: MA_push_stack failed",0);
    }
    else {
      MA_get_pointer(local_30,&local_28);
      memhandle = local_28;
    }
  }
  uVar5 = (ulong)((uint)memhandle & 0xf);
  local_28 = (Integer *)((0x10 - uVar5) + (long)memhandle);
  if (uVar5 == 0) {
    local_28 = memhandle;
  }
  if ((ga_usesMA == 0) && (local_30 = 0x10 - uVar5, uVar5 == 0)) {
    local_30 = 0;
  }
  if (local_28 == (Integer *)0x0) {
    pnga_error("ga_malloc failed",0);
  }
  *local_28 = local_30;
  return local_28 + 2;
}

Assistant:

void* ga_malloc(Integer nelem, int type, char *name)
{
    void *ptr;  
    size_t addr;
    Integer handle, adjust=0, bytes, item_size=GAsizeofM(pnga_type_f2c(type));
    Integer extra;

#if NOFORT
    type = pnga_type_f2c(type);
#endif

    /* extra space for 1.ALIGNMENT and 2.storing handle */
    if(ALIGNMENT%item_size)
       pnga_error("ga_malloc: GA datatype cannot be aligned.Adjust ALIGNMENT",0);
    extra = 2*ALIGNMENT/item_size;
    nelem += extra;

    if(ga_usesMA) { /* Uses Memory Allocator (MA) */
       if(MA_push_stack(type,nelem,name,&handle))  MA_get_pointer(handle,&ptr);
       else pnga_error("ga_malloc: MA_push_stack failed",0);
       addr = (size_t)ptr;
    }
    else { /* else, using external memory allocator */
       bytes = nelem*item_size;
       addr  = (size_t)(*ga_ext_alloc)(
               (size_t)bytes, (int)item_size, name);
    }

    /* Address Alignment */
    adjust = (Integer) (addr%ALIGNMENT);
    if(adjust != 0) { adjust=ALIGNMENT-adjust; addr+=adjust; }
    ptr = (void *)addr; 
    if(!ga_usesMA) handle = adjust;

    if(ptr == NULL) pnga_error("ga_malloc failed", 0L);
    *((Integer*)ptr)=handle;/*store handle or adjustment-value in this buffer*/
    ptr = ((char*)ptr) + ALIGNMENT;

    return ptr;
}